

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAnalyzeAggregates(NameContext *pNC,Expr *pExpr)

{
  Walker w;
  Walker local_30;
  
  local_30.xExprCallback = analyzeAggregate;
  local_30.xSelectCallback = sqlite3WalkerDepthIncrease;
  local_30.xSelectCallback2 = sqlite3WalkerDepthDecrease;
  local_30.walkerDepth = 0;
  local_30.pParse = (Parse *)0x0;
  if (pExpr != (Expr *)0x0) {
    local_30.u.pNC = pNC;
    walkExpr(&local_30,pExpr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggregates(NameContext *pNC, Expr *pExpr){
  Walker w;
  w.xExprCallback = analyzeAggregate;
  w.xSelectCallback = sqlite3WalkerDepthIncrease;
  w.xSelectCallback2 = sqlite3WalkerDepthDecrease;
  w.walkerDepth = 0;
  w.u.pNC = pNC;
  w.pParse = 0;
  assert( pNC->pSrcList!=0 );
  sqlite3WalkExpr(&w, pExpr);
}